

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::_dumpBlockLiveness(BaseRAPass *this,String *sb,RABlock *block)

{
  uint uVar1;
  VirtReg *pVVar2;
  bool bVar3;
  RAWorkReg *pRVar4;
  long lVar5;
  char *str;
  uint32_t workId;
  uint32_t index;
  int iVar6;
  char *bitsName;
  
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 4) {
      return 0;
    }
    bitsName = "KILL";
    if (lVar5 == 2) {
      bitsName = "GEN ";
    }
    if (lVar5 == 1) {
      bitsName = "OUT ";
    }
    if (lVar5 == 0) {
      bitsName = "IN  ";
    }
    uVar1 = block->_liveBits[lVar5]._size;
    if ((this->_workRegs).super_ZoneVectorBase._size < uVar1) break;
    iVar6 = 0;
    for (index = 0; uVar1 != index; index = index + 1) {
      bVar3 = ZoneBitVector::bitAt(block->_liveBits + lVar5,index);
      if (bVar3) {
        pRVar4 = workRegById(this,index);
        if (iVar6 == 0) {
          String::appendFormat<char_const*&>(sb,"    %s [",&bitsName);
        }
        else {
          String::append(sb,", ",0xffffffffffffffff);
        }
        pVVar2 = pRVar4->_virtReg;
        if (*(uint *)&(pVVar2->_name).field_0 < 0xc) {
          str = (pVVar2->_name).field_0._wholeData + 4;
        }
        else {
          str = *(char **)((long)&(pVVar2->_name).field_0 + 8);
        }
        String::append(sb,str,0xffffffffffffffff);
        iVar6 = iVar6 + 1;
      }
    }
    if (iVar6 != 0) {
      String::append(sb,"]\n",0xffffffffffffffff);
    }
    lVar5 = lVar5 + 1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
             ,0x72a,"size <= workRegCount()");
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseRAPass::_dumpBlockLiveness(String& sb, const RABlock* block) noexcept {
  for (uint32_t liveType = 0; liveType < RABlock::kLiveCount; liveType++) {
    const char* bitsName = liveType == RABlock::kLiveIn  ? "IN  " :
                           liveType == RABlock::kLiveOut ? "OUT " :
                           liveType == RABlock::kLiveGen ? "GEN " : "KILL";

    const ZoneBitVector& bits = block->_liveBits[liveType];
    uint32_t size = bits.size();
    ASMJIT_ASSERT(size <= workRegCount());

    uint32_t n = 0;
    for (uint32_t workId = 0; workId < size; workId++) {
      if (bits.bitAt(workId)) {
        RAWorkReg* wReg = workRegById(workId);

        if (!n)
          sb.appendFormat("    %s [", bitsName);
        else
          sb.append(", ");

        sb.append(wReg->name());
        n++;
      }
    }

    if (n)
      sb.append("]\n");
  }

  return kErrorOk;
}